

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

ON_SubDEdgeSharpness ON_SubDEdgeSharpness::Union(ON_SubDEdgeSharpness *a,ON_SubDEdgeSharpness *b)

{
  float fVar1;
  ON_SubDEdgeSharpness OVar2;
  double dVar3;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float s [4];
  float local_18 [4];
  
  local_18[0] = 0.0;
  local_18[1] = 0.0;
  local_18[2] = 0.0;
  local_18[3] = 0.0;
  fVar7 = a->m_edge_sharpness[0];
  lVar6 = 0;
  if ((((0.0 <= fVar7) && (fVar9 = a->m_edge_sharpness[1], 0.0 < fVar9 || 0.0 < fVar7)) &&
      (fVar7 <= 4.0)) && ((lVar6 = 0, 0.0 <= fVar9 && (fVar9 <= 4.0)))) {
    local_18[1] = fVar9;
    local_18[0] = fVar7;
    lVar6 = 2;
  }
  uVar5 = (uint)lVar6;
  fVar7 = b->m_edge_sharpness[0];
  if (((0.0 <= fVar7) && (fVar9 = b->m_edge_sharpness[1], 0.0 < fVar9 || 0.0 < fVar7)) &&
     ((fVar7 <= 4.0 && ((0.0 <= fVar9 && (fVar9 <= 4.0)))))) {
    local_18[lVar6] = fVar7;
    local_18[lVar6 + 1] = fVar9;
    uVar5 = uVar5 + 2;
  }
  dVar3 = (double)local_18[0];
  if ((local_18[0] < 0.0) || (4.0 < dVar3)) {
    fVar7 = ON_FLT_QNAN;
    if ((dVar3 == 5.0) && (!NAN(dVar3))) {
      fVar7 = 5.0;
    }
  }
  else {
    dVar3 = Sanitize(dVar3,0.0);
    fVar7 = (float)dVar3;
  }
  fVar9 = fVar7;
  if (1 < uVar5) {
    uVar4 = 1;
    fVar8 = fVar7;
    do {
      fVar1 = local_18[uVar4];
      fVar7 = fVar1;
      if ((fVar8 <= fVar1) && (fVar7 = fVar8, fVar9 < fVar1)) {
        fVar9 = fVar1;
      }
      uVar4 = uVar4 + 1;
      fVar8 = fVar7;
    } while (uVar5 != uVar4);
  }
  OVar2.m_edge_sharpness[1] = fVar9;
  OVar2.m_edge_sharpness[0] = fVar7;
  return (ON_SubDEdgeSharpness)OVar2.m_edge_sharpness;
}

Assistant:

const ON_SubDEdgeSharpness ON_SubDEdgeSharpness::Union(
  const ON_SubDEdgeSharpness& a,
  const ON_SubDEdgeSharpness& b
)
{
  float s[4] = {};
  int count = 0;

  if (a.IsSharp())
  {
    s[0] = a.m_edge_sharpness[0];
    s[1] = a.m_edge_sharpness[1];
    count = 2;
  }
  if (b.IsSharp())
  {
    s[count] = b.m_edge_sharpness[0];
    s[count+1] = b.m_edge_sharpness[1];
    count += 2;
  }
  ON_SubDEdgeSharpness u = ON_SubDEdgeSharpness::FromConstant(s[0]);
  for ( int i = 1; i < count; ++i)
  { 
    float x = s[i];
    if (x < u.m_edge_sharpness[0])
      u.m_edge_sharpness[0] = x;
    else if (x > u.m_edge_sharpness[1])
      u.m_edge_sharpness[1] = x;
  }
  return u;
}